

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringDatatypeValidator.cpp
# Opt level: O0

void __thiscall
xercesc_4_0::StringDatatypeValidator::assignAdditionalFacet
          (StringDatatypeValidator *this,XMLCh *key,XMLCh *value,MemoryManager *manager)

{
  bool bVar1;
  InvalidDatatypeFacetException *pIVar2;
  MemoryManager *manager_local;
  XMLCh *value_local;
  XMLCh *key_local;
  StringDatatypeValidator *this_local;
  
  bVar1 = XMLString::equals(key,(XMLCh *)SchemaSymbols::fgELT_WHITESPACE);
  if (!bVar1) {
    pIVar2 = (InvalidDatatypeFacetException *)__cxa_allocate_exception(0x30);
    InvalidDatatypeFacetException::InvalidDatatypeFacetException
              (pIVar2,
               "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/validators/datatype/StringDatatypeValidator.cpp"
               ,0x6a,FACET_Invalid_Tag,key,(XMLCh *)0x0,(XMLCh *)0x0,(XMLCh *)0x0,manager);
    __cxa_throw(pIVar2,&InvalidDatatypeFacetException::typeinfo,
                InvalidDatatypeFacetException::~InvalidDatatypeFacetException);
  }
  bVar1 = XMLString::equals(value,(XMLCh *)SchemaSymbols::fgWS_PRESERVE);
  if (bVar1) {
    DatatypeValidator::setWhiteSpace((DatatypeValidator *)this,0);
  }
  else {
    bVar1 = XMLString::equals(value,(XMLCh *)SchemaSymbols::fgWS_REPLACE);
    if (bVar1) {
      DatatypeValidator::setWhiteSpace((DatatypeValidator *)this,1);
    }
    else {
      bVar1 = XMLString::equals(value,(XMLCh *)SchemaSymbols::fgWS_COLLAPSE);
      if (!bVar1) {
        pIVar2 = (InvalidDatatypeFacetException *)__cxa_allocate_exception(0x30);
        InvalidDatatypeFacetException::InvalidDatatypeFacetException
                  (pIVar2,
                   "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/validators/datatype/StringDatatypeValidator.cpp"
                   ,0x60,FACET_Invalid_WS,value,(XMLCh *)0x0,(XMLCh *)0x0,(XMLCh *)0x0,manager);
        __cxa_throw(pIVar2,&InvalidDatatypeFacetException::typeinfo,
                    InvalidDatatypeFacetException::~InvalidDatatypeFacetException);
      }
      DatatypeValidator::setWhiteSpace((DatatypeValidator *)this,2);
    }
  }
  DatatypeValidator::setFacetsDefined((DatatypeValidator *)this,0x4000);
  return;
}

Assistant:

void StringDatatypeValidator::assignAdditionalFacet(const XMLCh* const key
                                                  , const XMLCh* const value
                                                  , MemoryManager* const manager)
{
    if (XMLString::equals(key, SchemaSymbols::fgELT_WHITESPACE))
    {
        // whiteSpace = preserve | replace | collapse
        if (XMLString::equals(value, SchemaSymbols::fgWS_PRESERVE))
            setWhiteSpace(DatatypeValidator::PRESERVE);
        else if (XMLString::equals(value, SchemaSymbols::fgWS_REPLACE))
            setWhiteSpace(DatatypeValidator::REPLACE);
        else if (XMLString::equals(value, SchemaSymbols::fgWS_COLLAPSE))
            setWhiteSpace(DatatypeValidator::COLLAPSE);
        else
            ThrowXMLwithMemMgr1(InvalidDatatypeFacetException, XMLExcepts::FACET_Invalid_WS, value, manager);
        //("whiteSpace value '" + ws + "' must be one of 'preserve', 'replace', 'collapse'.");

        setFacetsDefined(DatatypeValidator::FACET_WHITESPACE);
    }
    else
    {
        ThrowXMLwithMemMgr1(InvalidDatatypeFacetException
                , XMLExcepts::FACET_Invalid_Tag
                , key
                , manager);
    }
}